

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O3

void polyscope::screenshot(string *filename,bool transparentBG)

{
  pointer pcVar1;
  uint w;
  uint h;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buff;
  uchar *local_68 [3];
  string local_50;
  
  lVar2 = render::engine;
  *(undefined1 *)(render::engine + 0x221) = 1;
  if ((int)CONCAT71(in_register_00000031,transparentBG) != 0) {
    *(undefined1 *)(lVar2 + 0x220) = 1;
  }
  processLazyProperties();
  bVar3 = redrawRequested();
  requestRedraw();
  draw(false,false);
  if (bVar3) {
    requestRedraw();
  }
  h = view::bufferHeight;
  w = view::bufferWidth;
  uVar10 = (ulong)view::bufferWidth;
  uVar9 = (ulong)view::bufferHeight;
  (**(code **)(**(long **)(render::engine + 0xc0) + 0x78))(local_68);
  if (0 < (int)h && !transparentBG) {
    uVar4 = 0;
    uVar5 = 0;
    do {
      uVar6 = uVar10;
      uVar7 = uVar4;
      if (0 < (int)w) {
        do {
          uVar8 = uVar7 & 0xffffffff;
          uVar7 = uVar7 + 4;
          uVar6 = uVar6 - 1;
          local_68[0][uVar8 + 3] = 0xff;
        } while (uVar6 != 0);
      }
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + uVar10 * 4;
    } while (uVar5 != uVar9);
  }
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + filename->_M_string_length);
  saveImage(&local_50,local_68[0],w,h,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  lVar2 = render::engine;
  *(undefined1 *)(render::engine + 0x221) = 0;
  if (transparentBG) {
    *(undefined1 *)(lVar2 + 0x220) = 0;
  }
  if (local_68[0] != (uchar *)0x0) {
    operator_delete(local_68[0]);
  }
  return;
}

Assistant:

void screenshot(std::string filename, bool transparentBG) {

  render::engine->useAltDisplayBuffer = true;
  if (transparentBG) render::engine->lightCopy = true; // copy directly in to buffer without blending

  // == Make sure we render first
  processLazyProperties();

  // save the redraw requested bit and restore it below
  bool requestedAlready = redrawRequested();
  requestRedraw();

  draw(false, false);

  if (requestedAlready) {
    requestRedraw();
  }

  // these _should_ always be accurate
  int w = view::bufferWidth;
  int h = view::bufferHeight;
  std::vector<unsigned char> buff = render::engine->displayBufferAlt->readBuffer();

  // Set alpha to 1
  if (!transparentBG) {
    for (int j = 0; j < h; j++) {
      for (int i = 0; i < w; i++) {
        int ind = i + j * w;
        buff[4 * ind + 3] = std::numeric_limits<unsigned char>::max();
      }
    }
  }

  // Save to file
  saveImage(filename, &(buff.front()), w, h, 4);

  render::engine->useAltDisplayBuffer = false;
  if (transparentBG) render::engine->lightCopy = false;
}